

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QList<QBenchmarkResult>>::emplace<QList<QBenchmarkResult>const&>
          (QMovableArrayOps<QList<QBenchmarkResult>_> *this,qsizetype i,
          QList<QBenchmarkResult> *args)

{
  bool bVar1;
  qsizetype qVar2;
  QList<QBenchmarkResult> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QList<QBenchmarkResult> tmp;
  QList<QBenchmarkResult> *in_stack_ffffffffffffff68;
  Inserter *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 uVar3;
  GrowthPosition in_stack_ffffffffffffff8c;
  QArrayDataPointer<QList<QBenchmarkResult>_> *in_stack_ffffffffffffff90;
  Inserter local_48;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<QList<QBenchmarkResult>_>::needsDetach
                    ((QArrayDataPointer<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff70);
  if (!bVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar2 = QArrayDataPointer<QList<QBenchmarkResult>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<QList<QBenchmarkResult>_> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar2 != 0)) {
      QArrayDataPointer<QList<QBenchmarkResult>_>::end
                ((QArrayDataPointer<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff70);
      QList<QBenchmarkResult>::QList
                ((QList<QBenchmarkResult> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      in_RDI->displaceTo = (QList<QBenchmarkResult> *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_00164bef;
    }
    if ((in_RSI == (QList<QBenchmarkResult> *)0x0) &&
       (qVar2 = QArrayDataPointer<QList<QBenchmarkResult>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<QList<QBenchmarkResult>_> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       qVar2 != 0)) {
      QArrayDataPointer<QList<QBenchmarkResult>_>::begin
                ((QArrayDataPointer<QList<QBenchmarkResult>_> *)0x164a7a);
      QList<QBenchmarkResult>::QList
                ((QList<QBenchmarkResult> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QList<QBenchmarkResult> *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_00164bef;
    }
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QBenchmarkResult>::QList
            ((QList<QBenchmarkResult> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = in_RDI->displaceTo != (QList<QBenchmarkResult> *)0x0;
  uVar3 = bVar1 && in_RSI == (QList<QBenchmarkResult> *)0x0;
  QArrayDataPointer<QList<QBenchmarkResult>_>::detachAndGrow
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,(qsizetype)in_RDI,
             (QList<QBenchmarkResult> **)CONCAT17(uVar3,in_stack_ffffffffffffff78),
             (QArrayDataPointer<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff70);
  if (bVar1 && in_RSI == (QList<QBenchmarkResult> *)0x0) {
    QArrayDataPointer<QList<QBenchmarkResult>_>::begin
              ((QArrayDataPointer<QList<QBenchmarkResult>_> *)0x164b4b);
    QList<QBenchmarkResult>::QList
              ((QList<QBenchmarkResult> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QList<QBenchmarkResult> *)((long)&(in_RDI->displaceTo->d).d + 1);
  }
  else {
    QMovableArrayOps<QList<QBenchmarkResult>_>::Inserter::Inserter
              (in_RDI,(QArrayDataPointer<QList<QBenchmarkResult>_> *)
                      CONCAT17(uVar3,in_stack_ffffffffffffff78),(qsizetype)in_stack_ffffffffffffff70
               ,(qsizetype)in_stack_ffffffffffffff68);
    QMovableArrayOps<QList<QBenchmarkResult>_>::Inserter::insertOne
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QMovableArrayOps<QList<QBenchmarkResult>_>::Inserter::~Inserter(&local_48);
  }
  QList<QBenchmarkResult>::~QList((QList<QBenchmarkResult> *)0x164bef);
LAB_00164bef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }